

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSO.h
# Opt level: O0

pair<std::vector<double,_std::allocator<double>_>,_double> * __thiscall
PSO::optimize(pair<std::vector<double,_std::allocator<double>_>,_double> *__return_storage_ptr__,
             PSO *this,
             function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
             *fitFunc)

{
  allocator<double> *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  anon_class_16_2_158dac29 __gen;
  pointer this_00;
  bool bVar8;
  ulong uVar9;
  iterator __first;
  iterator __last;
  reference pvVar10;
  reference pvVar11;
  ostream *poVar12;
  result_type_conflict rVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Point_<int> local_1690;
  vector<double,_std::allocator<double>_> local_1688;
  double local_1670;
  Point_<int> local_1668;
  vector<double,_std::allocator<double>_> local_1660;
  double local_1648;
  pair<std::vector<double,_std::allocator<double>_>,_double> local_1640;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1620;
  Point_<int> local_1608;
  vector<double,_std::allocator<double>_> local_1600;
  Point_<int> local_15e8;
  vector<double,_std::allocator<double>_> local_15e0;
  Point_<int> local_15c8;
  vector<double,_std::allocator<double>_> local_15c0;
  Point_<int> local_15a8;
  vector<double,_std::allocator<double>_> local_15a0;
  result_type_conflict local_1588;
  double r2;
  double r1;
  int j;
  int i;
  vector<double,_std::allocator<double>_> local_1568;
  int local_154c;
  int iterator;
  vector<double,_std::allocator<double>_> local_1540;
  Point_<int> local_1528;
  vector<double,_std::allocator<double>_> local_1520;
  value_type *local_1508;
  double *col;
  iterator __end2;
  iterator __begin2;
  vector<double,_std::allocator<double>_> *__range2;
  undefined1 local_14e0 [8];
  vector<double,_std::allocator<double>_> temp;
  vector<double,_std::allocator<double>_> *row;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  undefined1 local_14a0 [8];
  vector<double,_std::allocator<double>_> velocity;
  value_type local_1480;
  vector<double,_std::allocator<double>_> local_1478;
  undefined1 local_1460 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  particles;
  undefined1 local_1440 [8];
  vector<double,_std::allocator<double>_> globalBest;
  allocator<double> local_13f1;
  undefined1 local_13f0 [8];
  vector<double,_std::allocator<double>_> localBest;
  uniform_real_distribution<double> rnd2;
  uniform_real_distribution<double> rnd1;
  mt19937 mersenne;
  Point goal;
  Environment ENV;
  function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)> *fitFunc_local;
  PSO *this_local;
  
  Environment::Environment((Environment *)&goal);
  Environment::getGoal((Environment *)&mersenne._M_p);
  uVar9 = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&rnd1._M_param._M_b,uVar9 & 0xffffffff);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&rnd2._M_param._M_b,this->minRand,this->maxRand);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             &localBest.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,1.0);
  iVar6 = this->numberOfDimensions;
  std::allocator<double>::allocator(&local_13f1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_13f0,(long)iVar6,&local_13f1);
  std::allocator<double>::~allocator(&local_13f1);
  __first = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_13f0);
  __last = std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_13f0);
  globalBest.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &rnd2._M_param._M_b;
  __gen.mersenne = (mt19937 *)&rnd1._M_param._M_b;
  __gen.rnd1 = (uniform_real_distribution<double> *)
               globalBest.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  std::
  generate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,PSO::optimize(std::function<double(std::vector<double,std::allocator<double>>,cv::Point_<int>)>)::_lambda()_1_>
            ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __first._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             __last._M_current,__gen);
  iVar6 = this->numberOfDimensions;
  paVar1 = (allocator<double> *)
           ((long)&particles.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1440,(long)iVar6,paVar1);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&particles.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_1440,
             (vector<double,_std::allocator<double>_> *)local_13f0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_1460);
  iVar6 = this->numberOfParticles;
  iVar7 = this->numberOfDimensions;
  local_1480 = 0.0;
  paVar1 = (allocator<double> *)
           ((long)&velocity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(paVar1);
  std::vector<double,_std::allocator<double>_>::vector(&local_1478,(long)iVar7,&local_1480,paVar1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_1460,(long)iVar6,&local_1478);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1478);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&velocity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_14a0);
  __range1 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)local_14a0,(long)this->numberOfDimensions,
             (value_type *)&__range1);
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_1460);
  row = (vector<double,_std::allocator<double>_> *)
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)local_1460);
  while( true ) {
    bVar8 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)&row);
    if (!bVar8) break;
    temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator*(&__end1);
    iVar6 = this->numberOfDimensions;
    std::allocator<double>::allocator((allocator<double> *)((long)&__range2 + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_14e0,(long)iVar6,
               (allocator<double> *)((long)&__range2 + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&__range2 + 7));
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)local_14e0);
    this_00 = temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)
                        temp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    col = (double *)
          std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)this_00);
    while( true ) {
      bVar8 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                  *)&col);
      if (!bVar8) break;
      local_1508 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator*(&__end2);
      rVar13 = std::uniform_real_distribution<double>::operator()
                         ((uniform_real_distribution<double> *)&rnd2._M_param._M_b,
                          (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                           *)&rnd1._M_param._M_b);
      *local_1508 = rVar13;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_14e0,local_1508);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end2);
    }
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)local_13f0);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_13f0,
               (vector<double,_std::allocator<double>_> *)local_14e0);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1520,(vector<double,_std::allocator<double>_> *)local_13f0);
    cv::Point_<int>::Point_(&local_1528,(Point_<int> *)&mersenne._M_p);
    dVar14 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
             operator()(fitFunc,&local_1520,&local_1528);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1540,(vector<double,_std::allocator<double>_> *)local_1440);
    cv::Point_<int>::Point_((Point_<int> *)&stack0xffffffffffffeab8,(Point_<int> *)&mersenne._M_p);
    dVar17 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
             operator()(fitFunc,&local_1540,(Point_<int> *)&stack0xffffffffffffeab8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_1540);
    std::vector<double,_std::allocator<double>_>::~vector(&local_1520);
    if (dVar14 < dVar17) {
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)local_1440);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_1440,
                 (vector<double,_std::allocator<double>_> *)local_13f0);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_14e0);
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  local_154c = 0;
  while( true ) {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1568,(vector<double,_std::allocator<double>_> *)local_1440);
    cv::Point_<int>::Point_((Point_<int> *)&j,(Point_<int> *)&mersenne._M_p);
    dVar14 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
             operator()(fitFunc,&local_1568,(Point_<int> *)&j);
    bVar8 = false;
    if (this->errorCon <= dVar14 && dVar14 != this->errorCon) {
      bVar8 = local_154c < this->maximumOfIteration;
    }
    std::vector<double,_std::allocator<double>_>::~vector(&local_1568);
    if (!bVar8) break;
    local_154c = local_154c + 1;
    for (r1._4_4_ = 0; r1._4_4_ < this->numberOfParticles; r1._4_4_ = r1._4_4_ + 1) {
      for (r1._0_4_ = 0; r1._0_4_ < this->numberOfDimensions; r1._0_4_ = r1._0_4_ + 1) {
        r2 = std::uniform_real_distribution<double>::operator()
                       ((uniform_real_distribution<double> *)
                        &localBest.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)&rnd1._M_param._M_b);
        local_1588 = std::uniform_real_distribution<double>::operator()
                               ((uniform_real_distribution<double> *)
                                &localBest.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                 *)&rnd1._M_param._M_b);
        dVar14 = this->W;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_14a0,(long)r1._0_4_);
        dVar17 = *pvVar10;
        dVar15 = this->C1 * r2;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_13f0,(long)r1._0_4_);
        dVar2 = *pvVar10;
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_1460,(long)r1._4_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)r1._0_4_);
        dVar3 = *pvVar10;
        dVar16 = this->C2 * local_1588;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_1440,(long)r1._0_4_);
        dVar4 = *pvVar10;
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_1460,(long)r1._4_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)r1._0_4_);
        dVar5 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_14a0,(long)r1._0_4_);
        *pvVar10 = dVar16 * (dVar4 - dVar5) + dVar14 * dVar17 + dVar15 * (dVar2 - dVar3);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_1460,(long)r1._4_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)r1._0_4_);
        dVar14 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_14a0,(long)r1._0_4_);
        dVar17 = *pvVar10;
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_1460,(long)r1._4_4_);
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](pvVar11,(long)r1._0_4_);
        *pvVar10 = dVar14 + dVar17;
      }
      pvVar11 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)local_1460,(long)r1._4_4_);
      std::vector<double,_std::allocator<double>_>::vector(&local_15a0,pvVar11);
      cv::Point_<int>::Point_(&local_15a8,(Point_<int> *)&mersenne._M_p);
      dVar14 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
               ::operator()(fitFunc,&local_15a0,&local_15a8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_15c0,(vector<double,_std::allocator<double>_> *)local_13f0);
      cv::Point_<int>::Point_(&local_15c8,(Point_<int> *)&mersenne._M_p);
      dVar17 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
               ::operator()(fitFunc,&local_15c0,&local_15c8);
      std::vector<double,_std::allocator<double>_>::~vector(&local_15c0);
      std::vector<double,_std::allocator<double>_>::~vector(&local_15a0);
      if (dVar14 < dVar17) {
        std::vector<double,_std::allocator<double>_>::clear
                  ((vector<double,_std::allocator<double>_> *)local_13f0);
        pvVar11 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)local_1460,(long)r1._4_4_);
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)local_13f0,pvVar11);
      }
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&local_15e0,(vector<double,_std::allocator<double>_> *)local_13f0);
    cv::Point_<int>::Point_(&local_15e8,(Point_<int> *)&mersenne._M_p);
    dVar14 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
             operator()(fitFunc,&local_15e0,&local_15e8);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_1600,(vector<double,_std::allocator<double>_> *)local_1440);
    cv::Point_<int>::Point_(&local_1608,(Point_<int> *)&mersenne._M_p);
    dVar17 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>::
             operator()(fitFunc,&local_1600,&local_1608);
    std::vector<double,_std::allocator<double>_>::~vector(&local_1600);
    std::vector<double,_std::allocator<double>_>::~vector(&local_15e0);
    if (dVar14 < dVar17) {
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)local_1440);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_1440,
                 (vector<double,_std::allocator<double>_> *)local_13f0);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&local_1620,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_1460);
    Environment::Update((Environment *)&goal,&local_1620);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_1620);
  }
  poVar12 = std::operator<<((ostream *)&std::cout,"Goal Point Is : ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)mersenne._M_p);
  poVar12 = std::operator<<(poVar12," , ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,mersenne._M_p._4_4_);
  std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1660,(vector<double,_std::allocator<double>_> *)local_1440);
  cv::Point_<int>::Point_(&local_1668,(Point_<int> *)&mersenne._M_p);
  local_1648 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
               ::operator()(fitFunc,&local_1660,&local_1668);
  std::make_pair<std::vector<double,std::allocator<double>>&,double>
            (&local_1640,(vector<double,_std::allocator<double>_> *)local_1440,&local_1648);
  std::pair<std::vector<double,_std::allocator<double>_>,_double>::operator=
            (&this->result,&local_1640);
  std::pair<std::vector<double,_std::allocator<double>_>,_double>::~pair(&local_1640);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1660);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1688,(vector<double,_std::allocator<double>_> *)local_1440);
  cv::Point_<int>::Point_(&local_1690,(Point_<int> *)&mersenne._M_p);
  local_1670 = std::function<double_(std::vector<double,_std::allocator<double>_>,_cv::Point_<int>)>
               ::operator()(fitFunc,&local_1688,&local_1690);
  std::make_pair<std::vector<double,std::allocator<double>>&,double>
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_1440,
             &local_1670);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1688);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_14a0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_1460);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1440);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_13f0);
  return __return_storage_ptr__;
}

Assistant:

auto optimize( function<double (vector<double>, Point )> fitFunc )
    {
        // Set A Instance From Environment And Get Goal Position
        Environment ENV;
        auto goal = ENV.getGoal();

        mt19937 mersenne( static_cast<unsigned int>( time( nullptr ) ) );
        uniform_real_distribution<> rnd1( minRand, maxRand );
        uniform_real_distribution<> rnd2( 0, 1 );

        vector<double> localBest( numberOfDimensions );
        generate( localBest.begin(), localBest.end(), [&]{ return rnd1( mersenne );} );

        vector<double> globalBest( numberOfDimensions );
        globalBest = localBest;

        vector <vector<double> > particles;
        particles.resize( numberOfParticles, vector<double>( numberOfDimensions, 0 ) );

        vector<double> velocity;
        velocity.resize( numberOfDimensions, 0 );

        for ( auto &row : particles )
        {
            vector<double> temp( numberOfDimensions );
            temp.clear();

            for ( auto &col : row )
            {
                col = rnd1( mersenne );
                temp.push_back( col );
            }

            localBest.clear();
            localBest = temp;

            if ( fitFunc( localBest, goal ) < fitFunc( globalBest, goal ) )
            {
                globalBest.clear();
                globalBest = localBest;
            }
        }

        int iterator = 0;
        while ( fitFunc( globalBest, goal ) > errorCon and iterator < maximumOfIteration )
        {
            ++iterator;
            for ( int i = 0; i < numberOfParticles; ++i )
            {
                for ( int j = 0; j < numberOfDimensions; ++j )
                {
                    double r1 = rnd2( mersenne );
                    double r2 = rnd2( mersenne );

                    velocity[j] = W * velocity[j] 
                                    + ( C1 * r1 * ( localBest[j]  - particles[i][j] ) )
                                    + ( C2 * r2 * ( globalBest[j] - particles[i][j] ) );

                    particles[i][j] = particles[i][j] + velocity[j];
                }

                if ( fitFunc( particles[i], goal ) < fitFunc( localBest, goal ) )
                {
                    localBest.clear();
                    localBest = particles[i];
                }
            }

            if ( fitFunc( localBest, goal ) < fitFunc( globalBest, goal ) )
            {
                globalBest.clear();
                globalBest = localBest;
            }
            
            // Update Monitor
            ENV.Update( particles );
        }

        // Print Goal Position
        cout<<"Goal Point Is : "<<goal.x<<" , "<<goal.y<<endl;

        this->result = make_pair( globalBest, fitFunc(globalBest, goal) );
        return make_pair( globalBest, fitFunc(globalBest, goal) );

    }